

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O3

void deqp::gles3::Functional::eval_rightShift_ivec4(ShaderEvalContext *c)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 in_XMM4 [16];
  undefined1 auVar10 [16];
  
  iVar1 = (int)c->in[0].m_data[0];
  iVar2 = (int)c->in[0].m_data[1];
  iVar3 = (int)c->in[0].m_data[2];
  iVar4 = (int)c->in[0].m_data[3];
  auVar6._0_4_ = (int)c->in[1].m_data[0];
  auVar6._4_4_ = (int)c->in[1].m_data[1];
  auVar6._8_4_ = (int)c->in[1].m_data[2];
  auVar6._12_4_ = (int)c->in[1].m_data[3];
  auVar7 = pshuflw(in_XMM2,auVar6,0x54);
  auVar8._0_4_ = iVar2 >> auVar7;
  auVar8._4_4_ = iVar3 >> auVar7;
  auVar8._8_4_ = iVar4 >> auVar7;
  auVar8._12_4_ = iVar1 >> auVar7;
  auVar10 = pshuflw(in_XMM4,auVar6,0xfe);
  auVar5._4_4_ = auVar6._8_4_;
  auVar5._0_4_ = auVar6._12_4_;
  auVar5._8_4_ = auVar6._4_4_;
  auVar5._12_4_ = auVar6._0_4_;
  auVar9 = pshuflw(auVar8,auVar5,0xfe);
  auVar6 = pshuflw(auVar5,auVar5,0x54);
  (c->color).m_data[0] =
       (float)(int)(~(0xffffffffU >> auVar6._0_8_) & iVar2 >> 0x1f | iVar2 >> auVar6);
  (c->color).m_data[1] =
       (float)(int)(~(0xffffffffU >> auVar9._0_8_) & iVar3 >> 0x1f | iVar3 >> auVar9);
  (c->color).m_data[2] =
       (float)(int)(~(0xffffffffU >> auVar10._0_8_) & iVar4 >> 0x1f | iVar4 >> auVar10);
  (c->color).m_data[3] =
       (float)(int)(~(0xffffffffU >> auVar7._0_8_) & iVar1 >> 0x1f | auVar8._12_4_);
  return;
}

Assistant:

Vector<T, 4>			swizzle		(int a, int b, int c, int d) const { DE_ASSERT(a >= 0 && a < Size); DE_ASSERT(b >= 0 && b < Size); DE_ASSERT(c >= 0 && c < Size); DE_ASSERT(d >= 0 && d < Size); return Vector<T, 4>(m_data[a], m_data[b], m_data[c], m_data[d]); }